

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VirtualIterator.hpp
# Opt level: O0

VirtualIterator<Saturation::ExtensionalityClause>
Lib::VirtualIterator<Saturation::ExtensionalityClause>::getEmpty(void)

{
  int iVar1;
  IteratorCore<Saturation::ExtensionalityClause> *core;
  IteratorCore<Saturation::ExtensionalityClause> *in_RDI;
  
  if (getEmpty()::inst == '\0') {
    iVar1 = __cxa_guard_acquire(&getEmpty()::inst);
    if (iVar1 != 0) {
      core = (IteratorCore<Saturation::ExtensionalityClause> *)
             EmptyIterator<Saturation::ExtensionalityClause>::operator_new(0xac4ada);
      EmptyIterator<Saturation::ExtensionalityClause>::EmptyIterator
                ((EmptyIterator<Saturation::ExtensionalityClause> *)core);
      VirtualIterator(&getEmpty::inst,core);
      __cxa_atexit(~VirtualIterator,&getEmpty::inst,&__dso_handle);
      __cxa_guard_release(&getEmpty()::inst);
    }
  }
  VirtualIterator((VirtualIterator<Saturation::ExtensionalityClause> *)in_RDI,&getEmpty::inst);
  return (VirtualIterator<Saturation::ExtensionalityClause>)in_RDI;
}

Assistant:

static VirtualIterator getEmpty()
  {
    static VirtualIterator inst(new EmptyIterator<T>());
    return inst;
  }